

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O2

void __thiscall BamTools::ConvertTool::ConvertTool(ConvertTool *this)

{
  ConvertSettings *pCVar1;
  OptionGroup *pOVar2;
  string *psVar3;
  allocator local_9c;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  (this->super_AbstractTool)._vptr_AbstractTool = (_func_int **)&PTR__ConvertTool_001f1cf8;
  pCVar1 = (ConvertSettings *)operator_new(0xc0);
  ConvertSettings::ConvertSettings(pCVar1);
  this->m_settings = pCVar1;
  this->m_impl = (ConvertToolPrivate *)0x0;
  std::__cxx11::string::string((string *)&local_98,"bamtools convert",(allocator *)&local_38);
  std::__cxx11::string::string
            ((string *)&local_78,"converts BAM to a number of other formats",&local_9b);
  std::__cxx11::string::string
            ((string *)&local_58,
             "-format <FORMAT> [-in <filename> -in <filename> ... | -list <filelist>] [-out <filename>] [-region <REGION>] [format-specific options]"
             ,&local_9c);
  Options::SetProgramInfo(&local_98,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"Input & Output",(allocator *)&local_78);
  pOVar2 = Options::CreateOptionGroup(&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-in",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"BAM filename",&local_9c);
  std::__cxx11::string::string((string *)&local_58,"the input BAM file(s)",&local_99);
  std::__cxx11::string::string((string *)&local_38,"",&local_9a);
  pCVar1 = this->m_settings;
  psVar3 = Options::StandardIn_abi_cxx11_();
  Options::
  AddValueOption<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const>
            (&local_98,&local_78,&local_58,&local_38,&pCVar1->HasInput,&pCVar1->InputFiles,pOVar2,
             psVar3);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-list",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"filename",&local_9c);
  std::__cxx11::string::string
            ((string *)&local_58,"the input BAM file list, one line per file",&local_99);
  std::__cxx11::string::string((string *)&local_38,"",&local_9a);
  Options::AddValueOption<std::__cxx11::string>
            (&local_98,&local_78,&local_58,&local_38,&this->m_settings->HasInputFilelist,
             &this->m_settings->InputFilelist,pOVar2);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-out",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"BAM filename",&local_9c);
  std::__cxx11::string::string((string *)&local_58,"the output BAM file",&local_99);
  std::__cxx11::string::string((string *)&local_38,"",&local_9a);
  pCVar1 = this->m_settings;
  psVar3 = Options::StandardOut_abi_cxx11_();
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_98,&local_78,&local_58,&local_38,&pCVar1->HasOutput,&pCVar1->OutputFilename,
             pOVar2,psVar3);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-format",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"FORMAT",&local_9c);
  std::__cxx11::string::string
            ((string *)&local_58,"the output file format - see README for recognized formats",
             &local_99);
  std::__cxx11::string::string((string *)&local_38,"",&local_9a);
  Options::AddValueOption<std::__cxx11::string>
            (&local_98,&local_78,&local_58,&local_38,&this->m_settings->HasFormat,
             &this->m_settings->Format,pOVar2);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-region",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"REGION",&local_9c);
  std::__cxx11::string::string
            ((string *)&local_58,
             "genomic region. Index file is recommended for better performance, and is used automatically if it exists. See \'bamtools help index\' for more details on creating one"
             ,&local_99);
  std::__cxx11::string::string((string *)&local_38,"",&local_9a);
  Options::AddValueOption<std::__cxx11::string>
            (&local_98,&local_78,&local_58,&local_38,&this->m_settings->HasRegion,
             &this->m_settings->Region,pOVar2);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"Pileup Options",(allocator *)&local_78);
  pOVar2 = Options::CreateOptionGroup(&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-fasta",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"FASTA filename",&local_9c);
  std::__cxx11::string::string((string *)&local_58,"FASTA reference file",&local_99);
  std::__cxx11::string::string((string *)&local_38,"",&local_9a);
  Options::AddValueOption<std::__cxx11::string>
            (&local_98,&local_78,&local_58,&local_38,&this->m_settings->HasFastaFilename,
             &this->m_settings->FastaFilename,pOVar2);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-mapqual",(allocator *)&local_58);
  std::__cxx11::string::string
            ((string *)&local_78,"print the mapping qualities",(allocator *)&local_38);
  Options::AddOption(&local_98,&local_78,&this->m_settings->IsPrintingPileupMapQualities,pOVar2);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"SAM Options",(allocator *)&local_78);
  pOVar2 = Options::CreateOptionGroup(&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-noheader",(allocator *)&local_58);
  std::__cxx11::string::string
            ((string *)&local_78,"omit the SAM header from output",(allocator *)&local_38);
  Options::AddOption(&local_98,&local_78,&this->m_settings->IsOmittingSamHeader,pOVar2);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

ConvertTool::ConvertTool()
    : AbstractTool()
    , m_settings(new ConvertSettings)
    , m_impl(0)
{
    // set program details
    Options::SetProgramInfo("bamtools convert", "converts BAM to a number of other formats",
                            "-format <FORMAT> [-in <filename> -in <filename> ... | -list "
                            "<filelist>] [-out <filename>] [-region <REGION>] [format-specific "
                            "options]");

    // set up options
    OptionGroup* IO_Opts = Options::CreateOptionGroup("Input & Output");
    Options::AddValueOption("-in", "BAM filename", "the input BAM file(s)", "",
                            m_settings->HasInput, m_settings->InputFiles, IO_Opts,
                            Options::StandardIn());
    Options::AddValueOption("-list", "filename", "the input BAM file list, one line per file", "",
                            m_settings->HasInputFilelist, m_settings->InputFilelist, IO_Opts);
    Options::AddValueOption("-out", "BAM filename", "the output BAM file", "",
                            m_settings->HasOutput, m_settings->OutputFilename, IO_Opts,
                            Options::StandardOut());
    Options::AddValueOption("-format", "FORMAT",
                            "the output file format - see README for recognized formats", "",
                            m_settings->HasFormat, m_settings->Format, IO_Opts);
    Options::AddValueOption("-region", "REGION",
                            "genomic region. Index file is recommended for better performance, and "
                            "is used automatically if it exists. See \'bamtools help index\' for "
                            "more details on creating one",
                            "", m_settings->HasRegion, m_settings->Region, IO_Opts);

    OptionGroup* PileupOpts = Options::CreateOptionGroup("Pileup Options");
    Options::AddValueOption("-fasta", "FASTA filename", "FASTA reference file", "",
                            m_settings->HasFastaFilename, m_settings->FastaFilename, PileupOpts);
    Options::AddOption("-mapqual", "print the mapping qualities",
                       m_settings->IsPrintingPileupMapQualities, PileupOpts);

    OptionGroup* SamOpts = Options::CreateOptionGroup("SAM Options");
    Options::AddOption("-noheader", "omit the SAM header from output",
                       m_settings->IsOmittingSamHeader, SamOpts);
}